

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msdfgen.cpp
# Opt level: O1

void msdfgen::generatePseudoSDF_legacy
               (Bitmap<float> *output,Shape *shape,double range,Vector2 *scale,Vector2 *translate)

{
  bool bVar1;
  int iVar2;
  EdgeSegment *pEVar3;
  float *pfVar4;
  uint uVar5;
  EdgeHolder *this;
  EdgeHolder *this_00;
  int x;
  pointer pCVar6;
  double extraout_XMM0_Qa;
  double dVar7;
  Vector2 VVar8;
  SignedDistance a;
  double param;
  SignedDistance local_c0;
  double local_b0;
  double local_a8;
  double local_a0;
  uint local_98;
  uint local_94;
  double local_90;
  double local_88;
  ulong local_80;
  Bitmap<float> *local_78;
  double local_70;
  Vector2 *local_68;
  Vector2 *local_60;
  double local_58;
  double local_50;
  double local_48;
  Vector2 local_40;
  
  local_70 = range;
  local_68 = scale;
  local_60 = translate;
  iVar2 = Bitmap<float>::width(output);
  local_78 = output;
  local_98 = Bitmap<float>::height(output);
  if (0 < (int)local_98) {
    local_80 = 0;
    local_b0 = 0.0;
    do {
      local_94 = ~(uint)local_80 + local_98;
      if (shape->inverseYAxis == false) {
        local_94 = (uint)local_80;
      }
      if (0 < iVar2) {
        local_58 = local_b0 + 0.5;
        x = 0;
        local_50 = 0.0;
        do {
          Vector2::Vector2(&local_40,local_50 + 0.5,local_58);
          local_c0 = (SignedDistance)Vector2::operator/(&local_40,local_68);
          VVar8 = Vector2::operator-((Vector2 *)&local_c0,local_60);
          local_90 = VVar8.y;
          local_88 = VVar8.x;
          SignedDistance::SignedDistance(&local_c0);
          pCVar6 = (shape->contours).
                   super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (pCVar6 == (shape->contours).
                        super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
            local_a8 = 0.0;
            this = (EdgeHolder *)0x0;
          }
          else {
            local_a8 = 0.0;
            this = (EdgeHolder *)0x0;
            do {
              for (this_00 = (pCVar6->edges).
                             super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  this_00 !=
                  (pCVar6->edges).
                  super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
                  _M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
                pEVar3 = EdgeHolder::operator->(this_00);
                dVar7 = local_90;
                (*pEVar3->_vptr_EdgeSegment[5])(local_88,pEVar3,&local_40);
                a.dot = dVar7;
                a.distance = extraout_XMM0_Qa;
                local_a0 = extraout_XMM0_Qa;
                local_48 = dVar7;
                bVar1 = operator<(a,local_c0);
                if (bVar1) {
                  local_c0.dot = local_48;
                  local_c0.distance = local_a0;
                  local_a8 = local_40.x;
                  this = this_00;
                }
              }
              pCVar6 = pCVar6 + 1;
            } while (pCVar6 != (shape->contours).
                               super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          }
          if (this != (EdgeHolder *)0x0) {
            pEVar3 = EdgeHolder::operator->(this);
            (*pEVar3->_vptr_EdgeSegment[6])(local_88,local_90,local_a8,pEVar3,&local_c0);
          }
          local_a0 = (double)CONCAT44(local_a0._4_4_,(float)(local_c0.distance / local_70 + 0.5));
          pfVar4 = Bitmap<float>::operator()(local_78,x,local_94);
          *pfVar4 = local_a0._0_4_;
          local_50 = local_50 + 1.0;
          x = x + 1;
        } while (x != iVar2);
      }
      local_b0 = local_b0 + 1.0;
      uVar5 = (int)local_80 + 1;
      local_80 = (ulong)uVar5;
    } while (uVar5 != local_98);
  }
  return;
}

Assistant:

void generatePseudoSDF_legacy(Bitmap<float> &output, const Shape &shape, double range, const Vector2 &scale, const Vector2 &translate) {
    int w = output.width(), h = output.height();
#ifdef MSDFGEN_USE_OPENMP
    #pragma omp parallel for
#endif
    for (int y = 0; y < h; ++y) {
        int row = shape.inverseYAxis ? h-y-1 : y;
        for (int x = 0; x < w; ++x) {
            Point2 p = Vector2(x+.5, y+.5)/scale-translate;
            SignedDistance minDistance;
            const EdgeHolder *nearEdge = NULL;
            double nearParam = 0;
            for (std::vector<Contour>::const_iterator contour = shape.contours.begin(); contour != shape.contours.end(); ++contour)
                for (std::vector<EdgeHolder>::const_iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge) {
                    double param;
                    SignedDistance distance = (*edge)->signedDistance(p, param);
                    if (distance < minDistance) {
                        minDistance = distance;
                        nearEdge = &*edge;
                        nearParam = param;
                    }
                }
            if (nearEdge)
                (*nearEdge)->distanceToPseudoDistance(minDistance, p, nearParam);
            output(x, row) = float(minDistance.distance/range+.5);
        }
    }
}